

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,long i)

{
  QTextStreamPrivate *pQVar1;
  long in_RSI;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  QTextStreamPrivate *unaff_retaddr;
  QTextStreamPrivate *d;
  char *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  int line;
  char *in_stack_ffffffffffffffa8;
  QTextStream *local_30;
  undefined1 in_stack_fffffffffffffff7;
  qulonglong number;
  
  line = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  number = *(qulonglong *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QTextStream *)0x4ac29f);
  if ((pQVar1->string == (QString *)0x0) && (pQVar1->device == (QIODevice *)0x0)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,in_stack_ffffffffffffffa8,line,in_stack_ffffffffffffff98);
    QMessageLogger::warning((QMessageLogger *)&stack0xffffffffffffffd8,"QTextStream: No device");
    local_30 = in_RDI;
  }
  else {
    QtPrivate::qUnsignedAbs<long,_true>(in_RSI);
    QTextStreamPrivate::putNumber(unaff_retaddr,number,(bool)in_stack_fffffffffffffff7);
    local_30 = in_RDI;
  }
  if (*(qulonglong *)(in_FS_OFFSET + 0x28) == number) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator<<(signed long i)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    d->putNumber(QtPrivate::qUnsignedAbs(i), i < 0);
    return *this;
}